

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

ExtPrivkey * __thiscall
cfd::core::DescriptorKeyReference::GetExtPrivkey
          (ExtPrivkey *__return_storage_ptr__,DescriptorKeyReference *this)

{
  CfdException *this_00;
  allocator local_39;
  undefined1 local_38 [32];
  
  if (this->key_type_ == kDescriptorKeyBip32Priv) {
    ExtPrivkey::ExtPrivkey(__return_storage_ptr__,&this->extprivkey_);
    return __return_storage_ptr__;
  }
  local_38._0_8_ = "cfdcore_descriptor.cpp";
  local_38._8_4_ = 0x19f;
  local_38._16_8_ = "GetExtPrivkey";
  logger::warn<>((CfdSourceLocation *)local_38,"Failed to GetExtPrivkey. unsupported key type.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"GetExtPrivkey unsupported key type.",&local_39)
  ;
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPrivkey DescriptorKeyReference::GetExtPrivkey() const {
  if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
    return extprivkey_;
  }
  warn(CFD_LOG_SOURCE, "Failed to GetExtPrivkey. unsupported key type.");
  throw CfdException(
      CfdError::kCfdIllegalArgumentError,
      "GetExtPrivkey unsupported key type.");
}